

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CartesianProduct.cpp
# Opt level: O1

void __thiscall
mnf::CartesianProduct::applyInvTransport_
          (CartesianProduct *this,RefMat *out,ConstRefMat *in,ConstRefVec *x,ConstRefVec *v)

{
  Manifold *this_00;
  bool bVar1;
  pointer psVar2;
  size_t ic;
  long lVar3;
  ConstRefVec local_1d8;
  ConstRefVec local_1a8;
  ConstRefMat local_178;
  RefMat local_138;
  ConstSegment local_110;
  ConstSegment local_d8;
  Type local_a0;
  Type local_68;
  
  psVar2 = (this->subManifolds_).
           super__Vector_base<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->subManifolds_).
      super__Vector_base<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar2) {
    lVar3 = 0;
    ic = 0;
    do {
      this_00 = *(Manifold **)
                 ((long)&(psVar2->
                         super___shared_ptr<const_mnf::Manifold,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                 + lVar3);
      local_178.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value =
           (out->
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           ).
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
           .m_cols.m_value;
      local_178.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_data = (out->
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                ).
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                .
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                .m_data;
      local_178.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_rows.m_value =
           (out->
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           ).
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
           .m_rows.m_value;
      local_178.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .m_stride.m_outer.m_value =
           (out->
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           ).m_stride.m_outer.m_value;
      Manifold::getView<2,1>(&local_68,&this->super_Manifold,(RefMat *)&local_178,ic,ic);
      local_138.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_data = (PointerType)0x0;
      local_138.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_rows.m_value = 0;
      local_138.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value = 0;
      local_138.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .m_stride.m_outer.m_value = 0;
      bVar1 = Eigen::
              RefBase<Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>>::
              construct<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>>,_1,_1,true>>
                        ((RefBase<Eigen::Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>>>
                          *)&local_138,&local_68);
      if (!bVar1) {
        __assert_fail("success","/usr/include/eigen3/Eigen/src/Core/Ref.h",0x141,
                      "Eigen::Ref<Eigen::Matrix<double, -1, -1>>::Ref(const DenseBase<Derived> &, typename internal::enable_if<bool(Traits::template match<Derived>::MatchAtCompileTime), Derived>::type *) [PlainObjectType = Eigen::Matrix<double, -1, -1>, Options = 0, StrideType = Eigen::OuterStride<>, Derived = Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1>>, -1, -1, true>]"
                     );
      }
      Manifold::getConstView<2,1>(&local_a0,&this->super_Manifold,in,ic,ic);
      local_178.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value = 0;
      local_178.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .m_stride.m_outer.m_value = 0;
      local_178.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_data = (PointerType)0x0;
      local_178.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      .
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_rows.m_value = 0;
      local_178.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_data = (double *)0x0;
      local_178.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_rows = 0;
      local_178.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_cols = 0;
      Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>const,0,Eigen::OuterStride<-1>>::
      construct<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0,Eigen::OuterStride<_1>>const,_1,_1,true>>
                ((Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0,Eigen::OuterStride<_1>> *)
                 &local_178,&local_a0);
      Manifold::getConstView<0>(&local_d8,&this->super_Manifold,x,ic);
      local_1a8.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
      m_data = (double *)0x0;
      local_1a8.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
      m_rows = 0;
      local_1a8.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
      .
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
      .m_data = local_d8.
                super_Block<const_Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
                .
                super_BlockImpl<const_Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_Eigen::Dense>
                .
                super_BlockImpl_dense<const_Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_true>
                .
                super_MapBase<Eigen::Block<const_Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_0>
                .m_data;
      local_1a8.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
      .
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
      .m_rows.m_value =
           local_d8.
           super_Block<const_Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
           .
           super_BlockImpl<const_Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_Eigen::Dense>
           .
           super_BlockImpl_dense<const_Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_true>
           .
           super_MapBase<Eigen::Block<const_Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_0>
           .m_rows.m_value;
      if (local_d8.
          super_Block<const_Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
          .
          super_BlockImpl<const_Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<const_Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_true>
          .
          super_MapBase<Eigen::Block<const_Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_0>
          .m_rows.m_value < 0 &&
          local_d8.
          super_Block<const_Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
          .
          super_BlockImpl<const_Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<const_Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_true>
          .
          super_MapBase<Eigen::Block<const_Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_0>
          .m_data != (PointerType)0x0) {
LAB_00119f7c:
        __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                      ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                      "Eigen::MapBase<Eigen::Ref<const Eigen::Matrix<double, -1, 1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, Level = 0]"
                     );
      }
      Manifold::getConstView<1>(&local_110,&this->super_Manifold,v,ic);
      local_1d8.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
      m_data = (double *)0x0;
      local_1d8.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
      m_rows = 0;
      local_1d8.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
      .
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
      .m_data = local_110.
                super_Block<const_Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
                .
                super_BlockImpl<const_Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_Eigen::Dense>
                .
                super_BlockImpl_dense<const_Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_true>
                .
                super_MapBase<Eigen::Block<const_Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_0>
                .m_data;
      local_1d8.
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
      .
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
      .m_rows.m_value =
           local_110.
           super_Block<const_Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
           .
           super_BlockImpl<const_Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_Eigen::Dense>
           .
           super_BlockImpl_dense<const_Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_true>
           .
           super_MapBase<Eigen::Block<const_Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_0>
           .m_rows.m_value;
      if (local_110.
          super_Block<const_Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
          .
          super_BlockImpl<const_Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<const_Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_true>
          .
          super_MapBase<Eigen::Block<const_Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_0>
          .m_rows.m_value < 0 &&
          local_110.
          super_Block<const_Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>
          .
          super_BlockImpl<const_Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<const_Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false,_true>
          .
          super_MapBase<Eigen::Block<const_Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>,_0>
          .m_data != (PointerType)0x0) goto LAB_00119f7c;
      Manifold::applyInvTransport(this_00,&local_138,&local_178,&local_1a8,&local_1d8);
      free(local_1d8.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_data);
      free(local_1a8.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_data);
      free(local_178.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_data);
      ic = ic + 1;
      psVar2 = (this->subManifolds_).
               super__Vector_base<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x10;
    } while (ic < (ulong)((long)(this->subManifolds_).
                                super__Vector_base<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)psVar2 >> 4));
  }
  return;
}

Assistant:

void CartesianProduct::applyInvTransport_(RefMat out, const ConstRefMat& in,
                                          const ConstRefVec& x,
                                          const ConstRefVec& v) const
{
  for (size_t i = 0; i < subManifolds_.size(); ++i)
  {
    subManifolds_[i]->applyInvTransport(
        getView<F, T>(out, i), getConstView<F, T>(in, i), getConstView<R>(x, i),
        getConstView<T>(v, i));
  }
}